

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_allreduce_2tree_multiple
          (bsc_step_t depends,bsc_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
          bsc_size_t n)

{
  bsc_step_t local_34;
  int local_30;
  bsc_step_t finished;
  bsc_size_t i;
  bsc_size_t n_local;
  bsc_coll_params_t *params_local;
  bsc_group_t group_local;
  bsc_pid_t root_local;
  bsc_step_t depends_local;
  
  local_34 = depends;
  for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
    local_34 = bsc_allreduce_qtree_single
                         (depends,group,params[local_30].src,params[local_30].dst,
                          params[local_30].tmp,params[local_30].reducer,params[local_30].zero,
                          params[local_30].nmemb,params[local_30].size,2);
  }
  return local_34;
}

Assistant:

bsc_step_t bsc_allreduce_2tree_multiple( bsc_step_t depends,
                      bsc_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n)
{
    bsc_size_t i;
    bsc_step_t finished = depends;
    (void) root;
    for ( i = 0; i < n ; ++i ) {
        finished = bsc_allreduce_qtree_single( depends, group,
                   params[i].src, params[i].dst, params[i].tmp,
                   params[i].reducer, params[i].zero, 
                   params[i].nmemb, params[i].size, 2 );
    }

    return finished;
}